

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

int mpt_log(mpt_logger *out,char *where,int type,char *fmt,...)

{
  char in_AL;
  int iVar1;
  uint uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_e8.gp_offset = 0x20;
  local_e8.fp_offset = 0x30;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (out == (mpt_logger *)0x0) {
    out = mpt_log_default();
  }
  uVar2 = type | 0xb00;
  if ((type & 0x20U) != 0) {
    uVar2 = type;
  }
  if ((type & 0x7fU) == 0) {
    uVar2 = type;
  }
  iVar1 = (*out->_vptr->log)(out,where,uVar2,fmt,&local_e8);
  return iVar1;
}

Assistant:

extern int mpt_log(MPT_INTERFACE(logger) *out, const char *where, int type, const char *fmt, ... )
{
	va_list ap;
	int err;
	
	va_start(ap, fmt);
	
	if (!out) out = mpt_log_default();
	if (type & 0x7f && !(type & MPT_LOG(File))) {
		type |= MPT_ENUM(LogPretty) | MPT_ENUM(LogFunction);
	}
	err = out->_vptr->log(out, where, type, fmt, ap);
	va_end(ap);
	
	return err;
}